

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring.c
# Opt level: O3

_Bool run_container_contains(run_container_t *run,uint16_t pos)

{
  rle16_t *prVar1;
  int iVar2;
  uint uVar3;
  uint uVar4;
  
  if (0 < run->n_runs) {
    prVar1 = run->runs;
    iVar2 = run->n_runs + -1;
    uVar4 = 0;
    do {
      uVar3 = iVar2 + uVar4 >> 1;
      if (prVar1[uVar3].value < pos) {
        uVar4 = uVar3 + 1;
      }
      else {
        if (prVar1[uVar3].value <= pos) {
          return true;
        }
        iVar2 = uVar3 - 1;
      }
    } while ((int)uVar4 <= iVar2);
    if ((uVar4 != 0) &&
       ((int)((uint)pos - (uint)prVar1[(ulong)uVar4 - 1].value) <=
        (int)(uint)prVar1[(ulong)uVar4 - 1].length)) {
      return true;
    }
  }
  return false;
}

Assistant:

inline bool run_container_contains(const run_container_t *run, uint16_t pos) {
    int32_t index = interleavedBinarySearch(run->runs, run->n_runs, pos);
    if (index >= 0) return true;
    index = -index - 2;  // points to preceding value, possibly -1
    if (index != -1) {   // possible match
        int32_t offset = pos - run->runs[index].value;
        int32_t le = run->runs[index].length;
        if (offset <= le) return true;
    }
    return false;
}